

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

Move __thiscall banksia::ChessBoard::fromSanString(ChessBoard *this,string *str)

{
  byte bVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  pointer pPVar5;
  bool bVar6;
  undefined *puVar7;
  ulong uVar8;
  iterator iVar9;
  int iVar10;
  PieceType PVar11;
  long lVar12;
  Move *pMVar13;
  byte bVar14;
  ChessBoard *this_00;
  ChessBoard *this_01;
  size_type sVar15;
  uint uVar16;
  ulong uVar17;
  Move *pMVar18;
  Move MVar19;
  string s;
  vector<banksia::Move,_std::allocator<banksia::Move>_> goodMoves;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moveList;
  Hist hist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> destString;
  MoveFull move;
  int local_174;
  uint local_170;
  int local_16c;
  undefined1 local_160 [8];
  ulong local_158;
  char local_150 [16];
  ChessBoard *local_140;
  Move *local_138;
  iterator iStack_130;
  Move *local_128;
  ulong local_120;
  Move *local_118;
  Move *pMStack_110;
  undefined8 local_108;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [40];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *local_68 [2];
  char local_58 [20];
  MoveFull local_44;
  
  local_160 = (undefined1  [8])local_150;
  local_158 = 0;
  local_150[0] = '\0';
  sVar3 = str->_M_string_length;
  local_140 = this;
  if (sVar3 != 0) {
    pcVar4 = (str->_M_dataplus)._M_p;
    sVar15 = 0;
    do {
      bVar1 = pcVar4[sVar15];
      if (((0x2b < (ulong)bVar1) || ((0xc0800000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         (bVar1 != 0x78)) {
        std::__cxx11::string::push_back((char)local_160);
      }
      sVar15 = sVar15 + 1;
    } while (sVar3 != sVar15);
  }
  iVar10 = std::__cxx11::string::compare(local_160);
  if ((iVar10 == 0) || (iVar10 = std::__cxx11::string::compare(local_160), iVar10 == 0)) {
    pMVar18 = (Move *)0x3c;
    if ((local_140->super_BoardCore).side == black) {
      pMVar18 = (Move *)0x4;
    }
    iVar10 = std::__cxx11::string::compare(local_160);
    pMVar13 = (Move *)(ulong)(((int)pMVar18 + (uint)(iVar10 == 0) * 4) - 2);
    PVar11 = empty;
    goto LAB_0018065d;
  }
  uVar17 = 0;
  pMVar13 = (Move *)local_160;
  lVar12 = std::__cxx11::string::find((char *)pMVar13,0x18cc3e,0);
  this_00 = local_140;
  puVar7 = pieceTypeName;
  if (lVar12 != -1) {
    if (local_158 != lVar12 + 1U) {
      if (local_158 <= lVar12 + 1U) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      bVar1 = *(byte *)((long)local_160 + lVar12 + 1);
      bVar14 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar14 = bVar1;
      }
      pMVar13 = (Move *)strchr(pieceTypeName,(int)(char)bVar14);
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_160);
      uVar16 = (int)pMVar13 - (int)puVar7;
      uVar17 = (ulong)uVar16;
      std::__cxx11::string::operator=((string *)local_160,(string *)local_f8);
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      if ((uVar16 != 0 && pMVar13 != (Move *)0x0) && 1 < local_158) goto LAB_00180228;
    }
    pMVar13 = (Move *)((ulong)Move::illegalMove._0_8_ >> 0x20);
    pMVar18 = (Move *)Move::illegalMove._0_8_;
    PVar11 = Move::illegalMove.promotion;
    goto LAB_0018065d;
  }
LAB_00180228:
  std::__cxx11::string::substr((ulong)local_68,(ulong)local_160);
  uVar16 = coordinateStringToPos(local_68[0]);
  this_01 = this_00;
  iVar10 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[6])(this_00,(ulong)uVar16);
  uVar8 = local_158;
  local_120 = uVar17;
  if ((char)iVar10 == '\0') {
LAB_0018030e:
    pMVar13 = (Move *)((ulong)Move::illegalMove._0_8_ >> 0x20);
    local_170 = 0xffffffff;
    bVar6 = false;
    pMVar18 = (Move *)Move::illegalMove._0_8_;
    PVar11 = Move::illegalMove.promotion;
  }
  else {
    PVar11 = pawn;
    local_16c = -1;
    if (local_158 < 3) {
LAB_001803aa:
      local_170 = 0xffffffff;
LAB_001803b0:
      local_174 = -1;
LAB_001803b8:
      local_118 = (Move *)0x0;
      pMStack_110 = (Move *)0x0;
      local_108 = 0;
      (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x11])
                (this_00,&local_118,(ulong)(this_00->super_BoardCore).side);
      pMVar18 = pMStack_110;
      local_138 = (Move *)0x0;
      iStack_130._M_current = (Move *)0x0;
      local_128 = (Move *)0x0;
      if (local_118 != pMStack_110) {
        pMVar13 = local_118;
        do {
          if ((pMVar13->dest == uVar16) && (pMVar13->promotion == (PieceType)uVar17)) {
            pPVar5 = (this_00->super_BoardCore).pieces.
                     super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(this_00->super_BoardCore).pieces.
                              super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) <=
                (ulong)(long)pMVar13->from) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            if ((PVar11 == pPVar5[pMVar13->from].type) &&
               ((((char)((byte)((uint)local_174 >> 0x18) & (byte)((uint)local_16c >> 0x18)) < '\0'
                 || ((-1 < local_174 &&
                     (iVar10 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[9])(this_00),
                     iVar10 == local_174)))) ||
                ((-1 < local_16c &&
                 (iVar10 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[8])
                                     (this_00,(ulong)(uint)pMVar13->from), iVar10 == local_16c))))))
            {
              if (iStack_130._M_current == local_128) {
                std::vector<banksia::Move,std::allocator<banksia::Move>>::
                _M_realloc_insert<banksia::Move_const&>
                          ((vector<banksia::Move,std::allocator<banksia::Move>> *)&local_138,
                           iStack_130,pMVar13);
              }
              else {
                (iStack_130._M_current)->promotion = pMVar13->promotion;
                iVar10 = pMVar13->dest;
                (iStack_130._M_current)->from = pMVar13->from;
                (iStack_130._M_current)->dest = iVar10;
                iStack_130._M_current = iStack_130._M_current + 1;
              }
              local_170 = pMVar13->from;
            }
          }
          iVar9._M_current = iStack_130._M_current;
          pMVar13 = (Move *)&pMVar13[1].promotion;
        } while (pMVar13 != pMVar18);
        if (1 < (ulong)(((long)iStack_130._M_current - (long)local_138 >> 2) * -0x5555555555555555)
            && (long)iStack_130._M_current - (long)local_138 != 0) {
          pMVar13 = local_138;
          do {
            pMVar18 = (Move *)(ulong)uVar16;
            BoardCore::createFullMove
                      (&local_44,&this_00->super_BoardCore,pMVar13->from,uVar16,(PieceType)local_120
                      );
            local_c0 = local_b0;
            local_b8 = 0;
            local_b0[0] = 0;
            local_a0 = local_90;
            local_98 = 0;
            local_90[0] = 0;
            local_70 = 0;
            local_80 = 0;
            uStack_78 = 0;
            (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x15])(this_00,&local_44,local_f8);
            iVar10 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x13])
                               (this_00,(ulong)(this_00->super_BoardCore).side);
            (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x16])(this_00,local_f8);
            uVar2 = pMVar13->from;
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
            if (local_c0 != local_b0) {
              operator_delete(local_c0);
            }
          } while (((char)iVar10 != '\0') &&
                  (pMVar13 = pMVar13 + 1, this_00 = local_140, uVar2 = local_170,
                  pMVar13 != iVar9._M_current));
          this_00 = (ChessBoard *)(ulong)uVar2;
          local_170 = uVar2;
        }
        pMVar13 = local_138;
        if (local_138 != (Move *)0x0) {
          operator_delete(local_138);
        }
      }
      if (local_118 != (Move *)0x0) {
        operator_delete(local_118);
      }
    }
    else {
      if ((byte)(*(char *)local_160 + 0xbfU) < 0x1a) {
        PVar11 = charToPieceType(this_01,*(char *)local_160);
        if (PVar11 == empty) goto LAB_0018030e;
        lVar12 = 1;
      }
      else {
        PVar11 = pawn;
        lVar12 = 0;
      }
      if (uVar8 - lVar12 == 2) goto LAB_001803aa;
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_160);
      std::__cxx11::string::operator=((string *)local_160,(string *)local_f8);
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      if (uVar8 - lVar12 != 4) {
        if (local_158 == 0) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
        }
        local_174 = (int)*(char *)local_160;
        if (9 < local_174 - 0x30U) {
          local_16c = local_174 + -0x61;
          local_170 = 0xffffffff;
          if (0x19 < (byte)(*(char *)local_160 + 0x9fU)) {
            local_16c = -1;
          }
          goto LAB_001803b0;
        }
        local_174 = 0x38 - local_174;
        local_170 = 0xffffffff;
        goto LAB_001803b8;
      }
      local_170 = coordinateStringToPos((char *)local_160);
      pMVar18 = (Move *)(ulong)local_170;
      if ((int)local_170 < 0) goto LAB_001803b0;
    }
    bVar6 = true;
    PVar11 = (PieceType)this_00;
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (bVar6) {
    pMVar13 = (Move *)(ulong)uVar16;
    pMVar18 = (Move *)(ulong)local_170;
    PVar11 = (PieceType)local_120;
  }
LAB_0018065d:
  if (local_160 != (undefined1  [8])local_150) {
    operator_delete((void *)local_160);
  }
  MVar19._0_8_ = (ulong)pMVar18 & 0xffffffff | (long)pMVar13 << 0x20;
  MVar19.promotion = PVar11;
  return MVar19;
}

Assistant:

Move ChessBoard::fromSanString(const std::string& str)
{
    std::string s;
    for(auto ch : str) {
        if (ch != '+' && ch != 'x' && ch != '*' && ch != '#') {
            if (ch < ' ' || ch == '.') ch = ' ';
            s += ch;
        }
    }
    
    int from = -1, dest = -1, fromCol = -1, fromRow = -1;
    auto pieceType = PieceType::pawn, promotion = PieceType::empty;
    
    if (s == "O-O" || s == "O-O-O") {
        from = side == Side::black ? 4 : 60;
        dest = from + (s == "O-O" ? 2 : -2);
    } else {
        auto p = s.find("=");
        if (p != std::string::npos) {
            if (s.length() == p + 1) {
                return Move::illegalMove; // something wrong
            }
            char ch = s.at(p + 1);
            promotion = charToPieceType(ch);
            assert(isValidPromotion(promotion));
            
            s = s.substr(0, p);
            if (s.size() < 2 || promotion == PieceType::empty) {
                return Move::illegalMove;;
            }
        }
        
        auto destString = s.substr(s.length() - 2, 2);
        dest = coordinateStringToPos(destString.c_str());
        
        if (!isPositionValid(dest)) {
            return Move::illegalMove;;
        }
        
        if (s.length() > 2) {
            auto k = 0;
            char ch = s.at(0);
            if (ch >= 'A' && ch <= 'Z') {
                k++;
                pieceType = charToPieceType(ch);
                
                if (pieceType == PieceType::empty) {
                    return Move::illegalMove;;
                }
            }
            
            auto left = s.length() - k - 2;
            if (left > 0) {
                s = s.substr(k, left);
                if (left == 2) {
                    from = coordinateStringToPos(s.c_str());
                } else {
                    char ch = s.at(0);
                    if (isdigit(ch)) {
                        fromRow = 8 - ch + '0';
                    } else if (ch >= 'a' && ch <= 'z') {
                        fromCol = ch - 'a';
                    }
                }
            }
        }
        
        if (from < 0) {
            std::vector<MoveFull> moveList;
            gen(moveList, side);
            
            std::vector<Move> goodMoves;
            for (auto && m : moveList) {
                if (m.dest != dest || m.promotion != promotion ||
                    getPiece(m.from).type != pieceType) {
                    continue;
                }
                
                if ((fromRow < 0 && fromCol < 0) ||
                    (fromRow >= 0 && getRow(m.from) == fromRow) ||
                    (fromCol >= 0 && getColumn(m.from) == fromCol)) {
                    goodMoves.push_back(m);
                    from = m.from;
                }
            }
            
            if (goodMoves.size() > 1) {
                for(auto && m : goodMoves) {
                    MoveFull move = createFullMove(m.from, dest, promotion);
                    Hist hist;
                    make(move, hist);
                    auto incheck = isIncheck(side);
                    takeBack(hist);
                    if (!incheck) {
                        from = m.from;
                        break;
                    }
                }
            }
        }
    }
    
    assert(isValidPromotion(promotion));
    return Move(from, dest, promotion);
}